

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O0

int testUVProcessChain(int argc,char **argv)

{
  bool bVar1;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    argv_local._4_4_ = -1;
  }
  else {
    bVar1 = testUVProcessChainBuiltin(argv[1]);
    if (bVar1) {
      bVar1 = testUVProcessChainExternal(argv[1]);
      if (bVar1) {
        bVar1 = testUVProcessChainNone(argv[1]);
        if (bVar1) {
          argv_local._4_4_ = 0;
        }
        else {
          std::operator<<((ostream *)&std::cout,"While executing testUVProcessChainNone().\n");
          argv_local._4_4_ = -1;
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"While executing testUVProcessChainExternal().\n");
        argv_local._4_4_ = -1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"While executing testUVProcessChainBuiltin().\n");
      argv_local._4_4_ = -1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int testUVProcessChain(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVProcessChainBuiltin(argv[1])) {
    std::cout << "While executing testUVProcessChainBuiltin().\n";
    return -1;
  }

  if (!testUVProcessChainExternal(argv[1])) {
    std::cout << "While executing testUVProcessChainExternal().\n";
    return -1;
  }

  if (!testUVProcessChainNone(argv[1])) {
    std::cout << "While executing testUVProcessChainNone().\n";
    return -1;
  }

  return 0;
}